

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charls_jpegls_encoder.cpp
# Opt level: O0

void __thiscall
charls_jpegls_encoder::write_comment(charls_jpegls_encoder *this,const_byte_span comment)

{
  const_byte_span comment_00;
  uint8_t *puVar1;
  size_t sVar2;
  bool local_41;
  bool local_31;
  charls_jpegls_encoder *this_local;
  const_byte_span comment_local;
  
  comment_local.data_ = (uint8_t *)comment.size_;
  this_local = (charls_jpegls_encoder *)comment.data_;
  puVar1 = charls::const_byte_span::data((const_byte_span *)&this_local);
  local_31 = true;
  if (puVar1 == (uint8_t *)0x0) {
    local_31 = charls::const_byte_span::empty((const_byte_span *)&this_local);
  }
  charls::check_argument(local_31,InvalidJlsParameters);
  sVar2 = charls::const_byte_span::size((const_byte_span *)&this_local);
  charls::check_argument(sVar2 < 0xfffe,invalid_argument_size);
  local_41 = false;
  if (0 < (int)this->state_) {
    local_41 = (int)this->state_ < 4;
  }
  charls::check_operation(local_41);
  transition_to_tables_and_miscellaneous_state(this);
  comment_00.size_ = (size_t)comment_local.data_;
  comment_00.data_ = (uint8_t *)this_local;
  charls::jpeg_stream_writer::write_comment_segment(&this->writer_,comment_00);
  return;
}

Assistant:

void write_comment(const const_byte_span comment)
    {
        check_argument(comment.data() || comment.empty());
        check_argument(comment.size() <= segment_max_data_size, jpegls_errc::invalid_argument_size);
        check_operation(state_ >= state::destination_set && state_ < state::completed);

        transition_to_tables_and_miscellaneous_state();
        writer_.write_comment_segment(comment);
    }